

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  ulong uVar1;
  pointer pOVar2;
  pointer pAVar3;
  ParserBase *pPVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined1 auVar7 [8];
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_iterator __begin3_1;
  pointer pAVar12;
  ParserInfo *__s;
  const_iterator __begin3;
  pointer pOVar13;
  ulong uVar14;
  size_t *psVar15;
  long lVar16;
  bool bVar17;
  BasicResult<Catch::clara::detail::ParseState> result;
  TokenStream local_20f0;
  undefined1 local_20c8 [8];
  undefined1 local_20c0 [8];
  undefined1 local_20b8 [80];
  ParserResult local_2068;
  ParserInfo parseInfos [512];
  
  pOVar13 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pOVar2 - (long)pOVar13;
  pAVar3 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar12 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)pAVar3 - (long)pAVar12;
  __s = parseInfos;
  memset(__s,0,0x2000);
  for (; pOVar13 != pOVar2; pOVar13 = pOVar13 + 1) {
    __s->parser = (ParserBase *)pOVar13;
    __s = __s + 1;
  }
  for (; pAVar12 != pAVar3; pAVar12 = pAVar12 + 1) {
    __s->parser = (ParserBase *)pAVar12;
    __s = __s + 1;
  }
  ExeName::set(&local_2068,&this->m_exeName,exeName);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_2068);
  local_20c8._0_4_ = NoMatch;
  TokenStream::TokenStream((TokenStream *)local_20c0,tokens);
  BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
            (&result,(ParseState *)local_20c8);
  uVar1 = lVar11 / 0x60 + lVar16 / 0x78;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_20b8 + 8));
  do {
    (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
      _vptr_ResultBase[2])(&result);
    TokenStream::TokenStream
              ((TokenStream *)local_20c8,
               &result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.
                m_remainingTokens);
    uVar9 = local_20b8._8_8_;
    uVar8 = local_20b8._0_8_;
    auVar7 = local_20c0;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_20c8._4_4_,local_20c8._0_4_);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               local_20b8);
    if ((uVar8 == uVar9) && ((undefined1  [8])pbVar6 == auVar7)) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult(__return_storage_ptr__,&result);
      goto LAB_0019c870;
    }
    psVar15 = &parseInfos[0].count;
    for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
      pPVar4 = ((ParserInfo *)(psVar15 + -1))->parser;
      iVar10 = (*pPVar4->_vptr_ParserBase[4])(pPVar4);
      if (CONCAT44(extraout_var,iVar10) == 0) {
LAB_0019c744:
        (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
          _vptr_ResultBase[2])(&result);
        TokenStream::TokenStream
                  (&local_20f0,
                   &result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.
                    m_remainingTokens);
        (*pPVar4->_vptr_ParserBase[3])
                  ((BasicResult<Catch::clara::detail::ParseState> *)local_20c8,pPVar4,exeName,
                   &local_20f0);
        BasicResult<Catch::clara::detail::ParseState>::operator=
                  (&result,(BasicResult<Catch::clara::detail::ParseState> *)local_20c8);
        BasicResult<Catch::clara::detail::ParseState>::~BasicResult
                  ((BasicResult<Catch::clara::detail::ParseState> *)local_20c8);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector(&local_20f0.m_tokenBuffer);
        if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.m_type
            != Ok) {
          BasicResult<Catch::clara::detail::ParseState>::BasicResult(__return_storage_ptr__,&result)
          ;
          goto LAB_0019c870;
        }
        (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
          _vptr_ResultBase[2])(&result);
        if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.m_type !=
            NoMatch) {
          bVar17 = uVar14 < uVar1;
          *psVar15 = *psVar15 + 1;
          goto LAB_0019c7d3;
        }
      }
      else {
        uVar5 = *psVar15;
        iVar10 = (*pPVar4->_vptr_ParserBase[4])(pPVar4);
        if (uVar5 < CONCAT44(extraout_var_00,iVar10)) goto LAB_0019c744;
      }
      psVar15 = psVar15 + 2;
    }
    bVar17 = false;
LAB_0019c7d3:
    (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
      _vptr_ResultBase[2])(&result);
    if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.m_type ==
        ShortCircuitAll) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult(__return_storage_ptr__,&result);
      goto LAB_0019c870;
    }
  } while (bVar17);
  (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase._vptr_ResultBase
    [2])();
  TokenStream::TokenStream
            ((TokenStream *)local_20c8,
             &result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.
              m_remainingTokens);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20f0,
                   "Unrecognised token: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_20b8._0_8_ + 8));
  BasicResult<Catch::clara::detail::ParseState>::runtimeError
            (__return_storage_ptr__,(string *)&local_20f0);
  ::std::__cxx11::string::~string((string *)&local_20f0);
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             local_20b8);
LAB_0019c870:
  BasicResult<Catch::clara::detail::ParseState>::~BasicResult(&result);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }